

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

QualifiedColumnName *
duckdb::QualifiedColumnName::Deserialize
          (QualifiedColumnName *__return_storage_ptr__,Deserializer *deserializer)

{
  QualifiedColumnName(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,100,"catalog",&__return_storage_ptr__->catalog);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x65,"schema",&__return_storage_ptr__->schema);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x66,"table",&__return_storage_ptr__->table);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x67,"column",&__return_storage_ptr__->column);
  return __return_storage_ptr__;
}

Assistant:

QualifiedColumnName QualifiedColumnName::Deserialize(Deserializer &deserializer) {
	QualifiedColumnName result;
	deserializer.ReadPropertyWithDefault<string>(100, "catalog", result.catalog);
	deserializer.ReadPropertyWithDefault<string>(101, "schema", result.schema);
	deserializer.ReadPropertyWithDefault<string>(102, "table", result.table);
	deserializer.ReadPropertyWithDefault<string>(103, "column", result.column);
	return result;
}